

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void mjs::accept<mjs::print_visitor>(statement *s,print_visitor *v)

{
  int iVar1;
  char *pcVar2;
  wostream *pwVar3;
  
  iVar1 = (*(s->super_syntax_node)._vptr_syntax_node[3])();
  switch(iVar1) {
  case 0:
    print_visitor::operator()(v,(block_statement *)s);
    return;
  case 1:
    print_visitor::operator()(v,(variable_statement *)s);
    return;
  case 2:
    pwVar3 = v->os_;
    pcVar2 = "debugger;";
    break;
  case 3:
    print_visitor::operator()(v,(empty_statement *)s);
    return;
  case 4:
    print_visitor::operator()(v,(expression_statement *)s);
    return;
  case 5:
    print_visitor::operator()(v,(if_statement *)s);
    return;
  case 6:
    print_visitor::operator()(v,(do_statement *)s);
    return;
  case 7:
    print_visitor::operator()(v,(while_statement *)s);
    return;
  case 8:
    print_visitor::operator()(v,(for_statement *)s);
    return;
  case 9:
    print_visitor::operator()(v,(for_in_statement *)s);
    return;
  case 10:
    pwVar3 = v->os_;
    pcVar2 = "continue;";
    break;
  case 0xb:
    pwVar3 = v->os_;
    pcVar2 = "break;";
    break;
  case 0xc:
    print_visitor::operator()(v,(return_statement *)s);
    return;
  case 0xd:
    print_visitor::operator()(v,(with_statement *)s);
    return;
  case 0xe:
    print_visitor::operator()(v,(labelled_statement *)s);
    return;
  case 0xf:
    print_visitor::operator()(v,(switch_statement *)s);
    return;
  case 0x10:
    print_visitor::operator()(v,(throw_statement *)s);
    return;
  case 0x11:
    print_visitor::operator()(v,(try_statement *)s);
    return;
  case 0x12:
    std::operator<<(v->os_,"function");
    print_visitor::handle_function(v,(function_base *)(s + 1));
    return;
  default:
    __assert_fail("!\"Not implemented\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x3d6,
                  "auto mjs::accept(const statement &, Visitor &) [Visitor = mjs::print_visitor]");
  }
  std::operator<<(pwVar3,pcVar2);
  return;
}

Assistant:

auto accept(const statement& s, Visitor& v) {
    switch (s.type()) {
    case statement_type::block:                 return v(static_cast<const block_statement&>(s));
    case statement_type::variable:              return v(static_cast<const variable_statement&>(s));
    case statement_type::debugger:              return v(static_cast<const debugger_statement&>(s));
    case statement_type::empty:                 return v(static_cast<const empty_statement&>(s));
    case statement_type::expression:            return v(static_cast<const expression_statement&>(s));
    case statement_type::if_:                   return v(static_cast<const if_statement&>(s));
    case statement_type::do_:                   return v(static_cast<const do_statement&>(s));
    case statement_type::while_:                return v(static_cast<const while_statement&>(s));
    case statement_type::for_:                  return v(static_cast<const for_statement&>(s));
    case statement_type::for_in:                return v(static_cast<const for_in_statement&>(s));
    case statement_type::continue_:             return v(static_cast<const continue_statement&>(s));
    case statement_type::break_:                return v(static_cast<const break_statement&>(s));
    case statement_type::return_:               return v(static_cast<const return_statement&>(s));
    case statement_type::with:                  return v(static_cast<const with_statement&>(s));
    case statement_type::labelled:              return v(static_cast<const labelled_statement&>(s));
    case statement_type::switch_:               return v(static_cast<const switch_statement&>(s));
    case statement_type::throw_:                return v(static_cast<const throw_statement&>(s));
    case statement_type::try_:                  return v(static_cast<const try_statement&>(s));
    case statement_type::function_definition:   return v(static_cast<const function_definition&>(s));
    }
    assert(!"Not implemented");
    return v(s);
}